

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_compute_forward_repeat_f32(ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int n;
  int iVar3;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int k;
  int j;
  int i;
  int nrr;
  int ncr;
  int nr0;
  int nc0;
  int nr;
  int nc;
  int local_3c;
  int local_38;
  int local_34;
  
  if ((*in_RDI != 0) && (*in_RDI != 2)) {
    iVar1 = *(int *)(in_RDX + 8);
    iVar2 = *(int *)(in_RDX + 0xc);
    n = *(int *)(in_RSI + 8);
    iVar3 = *(int *)(in_RSI + 0xc);
    for (local_34 = 0; local_34 < iVar2 / iVar3; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < iVar1 / n; local_38 = local_38 + 1) {
        for (local_3c = 0; local_3c < iVar3; local_3c = local_3c + 1) {
          ggml_vec_cpy_f32(n,(float *)(*(long *)(in_RDX + 0x90) +
                                       (long)(local_34 * iVar3 + local_3c) *
                                       *(long *)(in_RDX + 0x20) +
                                      (long)(local_38 * n) * *(long *)(in_RDX + 0x18)),
                           (float *)(*(long *)(in_RSI + 0x90) +
                                    (long)local_3c * *(long *)(in_RSI + 0x20)));
        }
      }
    }
  }
  return;
}

Assistant:

static void ggml_compute_forward_repeat_f32(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        struct ggml_tensor * dst) {
    assert(params->ith == 0);
    assert(ggml_can_repeat(src0, dst));

    if (params->type == GGML_TASK_INIT || params->type == GGML_TASK_FINALIZE) {
        return;
    }

    // TODO: implement support for rank > 2 tensors
    assert(src0->ne[2] == 1);
    assert(src0->ne[3] == 1);
    assert( dst->ne[2] == 1);
    assert( dst->ne[3] == 1);

    const int nc  = dst->ne[0];
    const int nr  = dst->ne[1];
    const int nc0 = src0->ne[0];
    const int nr0 = src0->ne[1];
    const int ncr = nc/nc0; // guaranteed to be an integer due to the check in ggml_can_repeat
    const int nrr = nr/nr0; // guaranteed to be an integer due to the check in ggml_can_repeat

    // TODO: support for transposed / permuted tensors
    assert( dst->nb[0] == sizeof(float));
    assert(src0->nb[0] == sizeof(float));

    // TODO: maybe this is not optimal?
    for (int i = 0; i < nrr; i++) {
        for (int j = 0; j < ncr; j++) {
            for (int k = 0; k < nr0; k++) {
                ggml_vec_cpy_f32(nc0,
                        (float *) ((char *)  dst->data + (i*nr0 + k)*( dst->nb[1]) + j*nc0*( dst->nb[0])),
                        (float *) ((char *) src0->data + (        k)*(src0->nb[1])));
            }
        }
    }
}